

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_spherical_quadrature.hpp
# Opt level: O2

void __thiscall
IntegratorXX::RadialGridPartition<IntegratorXX::LebedevLaikov<double>>::
add_quad<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>
          (RadialGridPartition<IntegratorXX::LebedevLaikov<double>> *this,
          RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
          *rq,size_t idx,Quadrature<IntegratorXX::LebedevLaikov<double>_> *q)

{
  size_t idx_local;
  
  idx_local = idx;
  if (*(long *)(this + 8) == *(long *)this) {
    if (idx != 0) goto LAB_0013f701;
  }
  else if ((idx <= *(ulong *)(*(long *)(this + 8) + -8)) ||
          (((long)(rq->
                  super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
                  ).
                  super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(rq->
                  super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
                  ).
                  super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) - 1U <= idx)) {
LAB_0013f701:
    __assert_fail("partition_idx_.size() ? (idx > partition_idx_.back() && idx < (rq.npts()-1)) : (idx == 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wavefunction91[P]IntegratorXX/include/integratorxx/composite_quadratures/pruned_spherical_quadrature.hpp"
                  ,0x26,
                  "void IntegratorXX::RadialGridPartition<IntegratorXX::LebedevLaikov<double>>::add_quad(const RadialQuad &, size_t, const Quadrature<AngularQuad> &) [AngularQuad = IntegratorXX::LebedevLaikov<double>, RadialQuad = IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double, double>, IntegratorXX::MuraKnowlesRadialTraits>]"
                 );
  }
  std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,&idx_local);
  std::
  vector<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>,std::allocator<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>>>
  ::emplace_back<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>const&>
            ((vector<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>,std::allocator<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>>>
              *)(this + 0x18),q);
  return;
}

Assistant:

void add_quad( const RadialQuad& rq, size_t idx, 
		  const Quadrature<AngularQuad>& q ) { 
    assert(partition_idx_.size() ?
      (idx > partition_idx_.back() && idx < (rq.npts()-1)) : (idx == 0));
    (void)(rq);

    partition_idx_.emplace_back(idx);
    quads_.emplace_back(q);
  }